

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

void google::protobuf::internal::WireFormatLite::WriteFixed64
               (int field_number,uint64 value,CodedOutputStream *output)

{
  io::CodedOutputStream::WriteVarint32(output,field_number * 8 + 1);
  io::CodedOutputStream::WriteLittleEndian64(output,value);
  return;
}

Assistant:

void WireFormatLite::WriteFixed64(int field_number, uint64 value,
                                  io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_FIXED64, output);
  WriteFixed64NoTag(value, output);
}